

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_motion.cxx
# Opt level: O2

void __thiscall xray_re::xr_motion::~xr_motion(xr_motion *this)

{
  ~xr_motion(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

xr_motion::~xr_motion() {}